

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::link_data(NaVector *this,NaVector *rVect)

{
  if ((this->bOwnStorage == true) && (this->pVect != (NaReal *)0x0)) {
    operator_delete__(this->pVect);
  }
  this->bOwnStorage = false;
  this->nDim = rVect->nDim;
  this->pVect = rVect->pVect;
  return;
}

Assistant:

void
NaVector::link_data (NaVector& rVect)
{
    if(bOwnStorage){
        delete[] pVect;
    }
    bOwnStorage = false;
    nDim = rVect.nDim;
    pVect = rVect.pVect;
}